

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O2

ZSobolSampler *
pbrt::ZSobolSampler::Create
          (ParameterDictionary *parameters,Point2i fullResolution,FileLoc *loc,Allocator alloc)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  ZSobolSampler *pZVar4;
  RandomizeStrategy randomizer;
  int nsamp;
  allocator<char> local_9a;
  allocator<char> local_99;
  string s;
  int seed;
  Allocator alloc_local;
  Point2i fullResolution_local;
  string local_60;
  string local_40;
  
  alloc_local = alloc;
  fullResolution_local = fullResolution;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s,"pixelsamples",(allocator<char> *)&local_60);
  iVar2 = ParameterDictionary::GetOneInt(parameters,&s,0x10);
  std::__cxx11::string::~string((string *)&s);
  nsamp = iVar2;
  if ((char)Options[8] == '\x01') {
    piVar3 = pstd::optional<int>::value((optional<int> *)(Options + 7));
    nsamp = *piVar3;
  }
  if ((char)Options[0xb] == '\x01') {
    nsamp = 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s,"seed",(allocator<char> *)&local_60);
  iVar2 = ParameterDictionary::GetOneInt(parameters,&s,*Options);
  std::__cxx11::string::~string((string *)&s);
  seed = iVar2;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"randomization",&local_99);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"fastowen",&local_9a);
  ParameterDictionary::GetOneString(&s,parameters,&local_60,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  bVar1 = std::operator==(&s,"none");
  if (bVar1) {
    randomizer = None;
  }
  else {
    bVar1 = std::operator==(&s,"cranleypatterson");
    if (bVar1) {
      randomizer = CranleyPatterson;
    }
    else {
      bVar1 = std::operator==(&s,"permutedigits");
      if (bVar1) {
        randomizer = PermuteDigits;
      }
      else {
        bVar1 = std::operator==(&s,"fastowen");
        if (bVar1) {
          randomizer = FastOwen;
        }
        else {
          bVar1 = std::operator==(&s,"owen");
          if (!bVar1) {
            ErrorExit<std::__cxx11::string&>
                      (loc,"%s: unknown randomization strategy given to ZSobolSampler",&s);
          }
          randomizer = Owen;
        }
      }
    }
  }
  pZVar4 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::ZSobolSampler,int&,pbrt::Point2<int>&,pbrt::RandomizeStrategy&,int&>
                     (&alloc_local,&nsamp,&fullResolution_local,&randomizer,&seed);
  std::__cxx11::string::~string((string *)&s);
  return pZVar4;
}

Assistant:

ZSobolSampler *ZSobolSampler::Create(const ParameterDictionary &parameters,
                                     Point2i fullResolution, const FileLoc *loc,
                                     Allocator alloc) {
    int nsamp = parameters.GetOneInt("pixelsamples", 16);
    if (Options->pixelSamples)
        nsamp = *Options->pixelSamples;
    if (Options->quickRender)
        nsamp = 1;
    int seed = parameters.GetOneInt("seed", Options->seed);

    RandomizeStrategy randomizer;
    std::string s = parameters.GetOneString("randomization", "fastowen");
    if (s == "none")
        randomizer = RandomizeStrategy::None;
    else if (s == "cranleypatterson")
        randomizer = RandomizeStrategy::CranleyPatterson;
    else if (s == "permutedigits")
        randomizer = RandomizeStrategy::PermuteDigits;
    else if (s == "fastowen")
        randomizer = RandomizeStrategy::FastOwen;
    else if (s == "owen")
        randomizer = RandomizeStrategy::Owen;
    else
        ErrorExit(loc, "%s: unknown randomization strategy given to ZSobolSampler", s);

    return alloc.new_object<ZSobolSampler>(nsamp, fullResolution, randomizer, seed);
}